

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall helics::CommonCore::sendDisconnect(CommonCore *this,action_t disconnectType)

{
  FederateState *this_00;
  BaseTimeCoordinator *pBVar1;
  string_view message;
  FederateStates FVar2;
  uint uVar3;
  FedInfo **ppFVar4;
  long lVar5;
  uint uVar6;
  FedInfo **ppFVar7;
  uint uVar8;
  FedInfo *pFVar9;
  FedInfo **ppFVar10;
  string_view name;
  ActionMessage bye;
  ActionMessage disconnect;
  ActionMessage local_1a0;
  ActionMessage local_e8;
  
  if (8 < (this->super_BrokerBase).maxLogLevel.super___atomic_base<int>._M_i) {
    message._M_str = "sending disconnect";
    message._M_len = 0x12;
    name._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
    name._M_len = (this->super_BrokerBase).identifier._M_string_length;
    BrokerBase::sendToLogger
              (&this->super_BrokerBase,
               (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,9,name,message,
               false);
  }
  checkInFlightQueriesForDisconnect(this);
  ActionMessage::ActionMessage(&local_1a0,disconnectType);
  local_1a0.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
  if ((this->loopFederates).dataStorage.csize == 0) {
    uVar3 = (this->loopFederates).dataStorage.bsize;
    ppFVar4 = (this->loopFederates).dataStorage.dataptr;
    if ((long)(int)uVar3 == 0x20) {
      lVar5 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
      if (ppFVar4 == (FedInfo **)0x0) {
        ppFVar10 = (FedInfo **)
                   &gmlc::containers::
                    StableBlockVector<helics::FedInfo,5u,std::allocator<helics::FedInfo>>::end()::
                    emptyValue;
      }
      else {
        ppFVar10 = ppFVar4 + lVar5 + 1;
      }
      pFVar9 = *ppFVar10;
      uVar3 = 0;
      uVar6 = 0x20;
    }
    else {
      lVar5 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
      ppFVar10 = ppFVar4 + lVar5;
      pFVar9 = *ppFVar10 + (int)uVar3;
      uVar6 = uVar3;
    }
  }
  else {
    ppFVar4 = (this->loopFederates).dataStorage.dataptr;
    pFVar9 = *ppFVar4;
    lVar5 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
    uVar3 = 0;
    ppFVar10 = ppFVar4;
    uVar6 = (this->loopFederates).dataStorage.bsize;
  }
  if (ppFVar4 == (FedInfo **)0x0) {
    ppFVar7 = (FedInfo **)
              &gmlc::containers::
               StableBlockVector<helics::FedInfo,5u,std::allocator<helics::FedInfo>>::end()::
               emptyValue;
  }
  else {
    ppFVar7 = ppFVar4 + lVar5 + 1;
  }
  ppFVar4 = ppFVar4 + lVar5;
  if (uVar6 == 0x20) {
    ppFVar4 = ppFVar7;
  }
  uVar8 = 0;
  if (uVar6 != 0x20) {
    uVar8 = uVar6;
  }
  while ((uVar3 != uVar8 || (ppFVar10 != ppFVar4))) {
    this_00 = pFVar9->fed;
    FVar2 = FederateState::getState(this_00);
    if (FVar2 != FINISHED) {
      local_1a0.dest_id.gid = (this_00->global_id)._M_i.gid;
      FederateState::addAction(this_00,&local_1a0);
    }
    if ((this->super_BrokerBase).hasTimeDependency == true) {
      pBVar1 = (this->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
      (*pBVar1->_vptr_BaseTimeCoordinator[6])(pBVar1,(ulong)(uint)(this_00->global_id)._M_i.gid);
      pBVar1 = (this->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
      (*pBVar1->_vptr_BaseTimeCoordinator[7])(pBVar1,(ulong)(uint)(this_00->global_id)._M_i.gid);
    }
    if ((int)uVar3 < 0x1f) {
      pFVar9 = pFVar9 + 1;
      uVar3 = uVar3 + 1;
    }
    else {
      ppFVar10 = ppFVar10 + (ulong)(uVar3 - 0x1f >> 5) + 1;
      uVar3 = uVar3 + 1 & 0x1f;
      pFVar9 = (FedInfo *)((long)&(*ppFVar10)->fed + (ulong)(uVar3 << 4));
    }
  }
  if ((this->super_BrokerBase).hasTimeDependency != false) {
    BaseTimeCoordinator::disconnect
              ((this->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
  }
  if (this->filterFed != (FilterFederate *)0x0) {
    FilterFederate::handleMessage(this->filterFed,&local_1a0);
  }
  ActionMessage::ActionMessage(&local_e8,cmd_disconnect);
  local_e8.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
  (*(this->super_Core)._vptr_Core[0x6b])(this,0);
  ActionMessage::~ActionMessage(&local_e8);
  ActionMessage::~ActionMessage(&local_1a0);
  return;
}

Assistant:

void CommonCore::sendDisconnect(action_message_def::action_t disconnectType)
{
    LOG_CONNECTIONS(global_broker_id_local, identifier, "sending disconnect");
    checkInFlightQueriesForDisconnect();
    ActionMessage bye(disconnectType);
    bye.source_id = global_broker_id_local;
    for (auto fed : loopFederates) {
        if (fed->getState() != FederateStates::FINISHED) {
            bye.dest_id = fed->global_id;
            fed->addAction(bye);
        }
        if (hasTimeDependency) {
            timeCoord->removeDependency(fed->global_id);
            timeCoord->removeDependent(fed->global_id);
        }
    }
    if (hasTimeDependency) {
        timeCoord->disconnect();
    }
    if (filterFed != nullptr) {
        filterFed->handleMessage(bye);
    }
    ActionMessage disconnect(CMD_DISCONNECT);
    disconnect.source_id = global_broker_id_local;
    transmit(parent_route_id, disconnect);
}